

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void btf_16_w16_avx2(__m256i w0,__m256i w1,__m256i *in0,__m256i *in1,__m256i _r,int32_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar7 [32];
  undefined1 in_ZMM2 [64];
  
  auVar6 = vpunpcklwd_avx2((undefined1  [32])*in0,(undefined1  [32])*in1);
  auVar5 = vpunpckhwd_avx2((undefined1  [32])*in0,(undefined1  [32])*in1);
  auVar3 = vpmaddwd_avx2(auVar6,in_ZMM0._0_32_);
  auVar4 = vpmaddwd_avx2(auVar5,in_ZMM0._0_32_);
  auVar6 = vpmaddwd_avx2(auVar6,in_ZMM1._0_32_);
  auVar5 = vpmaddwd_avx2(auVar5,in_ZMM1._0_32_);
  auVar7 = in_ZMM2._0_32_;
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar4 = vpaddd_avx2(auVar4,auVar7);
  auVar6 = vpaddd_avx2(auVar6,auVar7);
  auVar5 = vpaddd_avx2(auVar5,auVar7);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)cos_bit));
  auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)cos_bit));
  auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)cos_bit));
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)cos_bit));
  alVar1 = (__m256i)vpackssdw_avx2(auVar3,auVar4);
  alVar2 = (__m256i)vpackssdw_avx2(auVar6,auVar5);
  *in0 = alVar1;
  *in1 = alVar2;
  return;
}

Assistant:

static inline void btf_16_w16_avx2(const __m256i w0, const __m256i w1,
                                   __m256i *in0, __m256i *in1, const __m256i _r,
                                   const int32_t cos_bit) {
  __m256i t0 = _mm256_unpacklo_epi16(*in0, *in1);
  __m256i t1 = _mm256_unpackhi_epi16(*in0, *in1);
  __m256i u0 = _mm256_madd_epi16(t0, w0);
  __m256i u1 = _mm256_madd_epi16(t1, w0);
  __m256i v0 = _mm256_madd_epi16(t0, w1);
  __m256i v1 = _mm256_madd_epi16(t1, w1);

  __m256i a0 = _mm256_add_epi32(u0, _r);
  __m256i a1 = _mm256_add_epi32(u1, _r);
  __m256i b0 = _mm256_add_epi32(v0, _r);
  __m256i b1 = _mm256_add_epi32(v1, _r);

  __m256i c0 = _mm256_srai_epi32(a0, cos_bit);
  __m256i c1 = _mm256_srai_epi32(a1, cos_bit);
  __m256i d0 = _mm256_srai_epi32(b0, cos_bit);
  __m256i d1 = _mm256_srai_epi32(b1, cos_bit);

  *in0 = _mm256_packs_epi32(c0, c1);
  *in1 = _mm256_packs_epi32(d0, d1);
}